

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *this_00;
  XmlOutput *this_01;
  XmlOutput *toTag;
  long in_FS_OFFSET;
  QString *in_stack_fffffffffffffe68;
  char *name;
  QString *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe98;
  char *ch;
  xml_output *o;
  XmlOutput *this_02;
  char local_90 [56];
  undefined1 local_58 [80];
  QString *local_8;
  
  local_8 = *(QString **)(in_FS_OFFSET + 0x28);
  name = "Tool";
  this_02 = (XmlOutput *)local_58;
  QString::QString(in_stack_fffffffffffffe68,in_stack_fffffffffffffe98);
  o = (xml_output *)(local_58 + 0x18);
  tag(in_stack_fffffffffffffe78);
  this_00 = XmlOutput::operator<<(this_02,o);
  QString::QString(in_stack_fffffffffffffe68,in_stack_fffffffffffffe98);
  ch = local_90;
  attrS((char *)in_stack_fffffffffffffe68,(QString *)this_00);
  this_01 = XmlOutput::operator<<(this_02,o);
  attrT(name,(triState)((ulong)this_01 >> 0x20));
  toTag = XmlOutput::operator<<(this_02,o);
  QString::QString((QString *)this_01,ch);
  closetag((QString *)toTag);
  XmlOutput::operator<<(this_02,o);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x27adda);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x27adf8);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x27ae0c);
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_8) {
    return (ssize_t)*(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCManifestTool &tool)
{
    xml << tag(_Tool)
        << attrS(_Name, _VCManifestTool)
        << attrT(_EmbedManifest, tool.EmbedManifest)
        << closetag(_Tool);
}